

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

Section * mocker::genBssSection(Section *__return_storage_ptr__,Module *irModule)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,".bss",&local_31);
  nasm::Section::Section(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genBssSection(const ir::Module &irModule) {
  nasm::Section res(".bss");
  return res;
}